

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

tuple<double,_double> __thiscall
Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,int iteration,double pi,double po,
          double s)

{
  uint8_t *__param;
  double dVar1;
  long lVar2;
  undefined8 game_00;
  bool bVar3;
  uint actionNum;
  int iVar4;
  uint action;
  mapped_type *ppNVar5;
  mapped_type this_00;
  double *strategy;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000014;
  Game *this_01;
  uint action_00;
  double *__wbegin;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  _Head_base<1UL,_double,_false> extraout_XMM0_Qa_01;
  double dVar9;
  _Head_base<0UL,_double,_false> value;
  tuple<double,_double> tVar10;
  undefined1 *puStack_170;
  double dStack_168;
  undefined1 local_160 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  tuple<double,_double> ret;
  string infoSet;
  
  this_01 = (Game *)CONCAT44(in_register_00000014,playerIndex);
  *(long *)&game[0x34].mTurnNum = *(long *)&game[0x34].mTurnNum + 1;
  puStack_170 = (undefined1 *)0x113ab6;
  value._M_head_impl = po;
  bVar3 = Kuhn::Game::done(this_01);
  if (bVar3) {
    puStack_170 = (undefined1 *)0x113ac4;
    dVar8 = Kuhn::Game::payoff(this_01,iteration);
    ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl = (_Head_base<1UL,_double,_false>)(dVar8 / s);
    (this->mEngine)._M_x[0] = 0x3ff0000000000000;
    (this->mEngine)._M_x[1] =
         (unsigned_long)
         ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
  }
  else {
    puStack_170 = (undefined1 *)0x113af7;
    Kuhn::Game::infoSetStr_abi_cxx11_
              ((string *)
               &ret.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>,
               this_01);
    puStack_170 = (undefined1 *)0x113aff;
    actionNum = Kuhn::Game::actionNum(this_01);
    puStack_170 = (undefined1 *)0x113b0e;
    iVar4 = Kuhn::Game::currentPlayer(this_01);
    if (*(char *)((long)game[0x35].mPayoff._M_elems[1] + (long)iVar4) == '\0') {
      puStack_170 = &LAB_00113e37;
      __assert_fail("mUpdate[player] && \"Outcome sampling with stochastically-weighted averaging cannot treat static player.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                    ,0x224,
                    "std::tuple<double, double> Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR(const T &, const int, const int, const double, const double, const double) [T = Kuhn::Game]"
                   );
    }
    puStack_170 = (undefined1 *)0x113b3b;
    ppNVar5 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&game[0x34].mCards,
                           (key_type *)
                           &ret.super__Tuple_impl<0UL,_double,_double>.
                            super__Head_base<0UL,_double,_false>);
    this_00 = *ppNVar5;
    if (this_00 == (mapped_type)0x0) {
      puStack_170 = (undefined1 *)0x113b4d;
      this_00 = (mapped_type)operator_new(0x30);
      puStack_170 = (undefined1 *)0x113b5b;
      Node::Node(this_00,actionNum);
      puStack_170 = (undefined1 *)0x113b6a;
      ppNVar5 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&game[0x34].mCards,
                             (key_type *)
                             &ret.super__Tuple_impl<0UL,_double,_double>.
                              super__Head_base<0UL,_double,_false>);
      *ppNVar5 = this_00;
    }
    puStack_170 = (undefined1 *)0x113b75;
    Node::updateStrategy(this_00);
    puStack_170 = (undefined1 *)0x113b7d;
    strategy = Node::strategy(this_00);
    uVar6 = (ulong)actionNum;
    lVar2 = -(uVar6 * 8 + 0xf & 0xfffffffffffffff0);
    __wbegin = (double *)((long)&dStack_168 + lVar2);
    if (iVar4 == iteration) {
      if (0 < (int)actionNum) {
        uVar7 = 0;
        do {
          __wbegin[uVar7] = strategy[uVar7] * 0.4 + 0.6 / (double)(int)actionNum;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
    else if (0 < (int)actionNum) {
      uVar7 = 0;
      do {
        __wbegin[uVar7] = strategy[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113c19;
    std::discrete_distribution<int>::param_type::param_type<double*>
              ((param_type *)(game_cp.mInfoSets[1] + 9),__wbegin,__wbegin + (int)actionNum);
    __param = game_cp.mInfoSets[1] + 9;
    infoSet.field_2._8_8_ = game;
    *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113c32;
    action = std::discrete_distribution<int>::operator()
                       ((discrete_distribution<int> *)__param,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)game,(param_type *)__param);
    *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113c4c;
    Kuhn::Game::Game((Game *)local_160,this_01);
    *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113c5b;
    Kuhn::Game::step((Game *)local_160,action);
    game_00 = infoSet.field_2._8_8_;
    dVar9 = 1.0;
    dVar8 = 1.0;
    if (iVar4 == iteration) {
      dVar8 = strategy[(int)action];
    }
    if (iVar4 != iteration) {
      dVar9 = strategy[(int)action];
    }
    dVar1 = __wbegin[(int)action];
    *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113cc0;
    tVar10 = outcomeSamplingCFR((Trainer<Kuhn::Game> *)
                                &dist._M_param._M_cp.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(Game *)game_00,
                                (int)local_160,iteration,dVar8 * pi,dVar9 * po,dVar1 * s);
    value = tVar10.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>.
            _M_head_impl;
    if (iVar4 == iteration) {
      if (0 < (int)actionNum) {
        action_00 = 0;
        do {
          if (action == action_00) {
            dVar8 = (1.0 - strategy[(int)action]) *
                    po * (double)ret.super__Tuple_impl<0UL,_double,_double>.
                                 super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>
                                 ._M_head_impl *
                    (double)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            dVar8 = strategy[(int)action] *
                    -(po * (double)ret.super__Tuple_impl<0UL,_double,_double>.
                                   super__Tuple_impl<1UL,_double>.
                                   super__Head_base<1UL,_double,_false>._M_head_impl) *
                    (double)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113d50;
          dVar9 = Node::regretSum(this_00,action_00);
          value._M_head_impl = dVar8 + dVar9;
          *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113d68;
          Node::regretSum(this_00,action_00,value._M_head_impl);
          action_00 = action_00 + 1;
        } while (actionNum != action_00);
      }
    }
    else {
      *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113d88;
      Node::strategySum(this_00,strategy,po / s);
    }
    (this->mEngine)._M_x[0] =
         (unsigned_long)
         ((double)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * strategy[(int)action]);
    (this->mEngine)._M_x[1] =
         (unsigned_long)
         ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
    if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113dc5;
      operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
      super__Head_base<1UL,_double,_false>._M_head_impl =
           (_Head_base<1UL,_double,_false>)(_Head_base<1UL,_double,_false>)extraout_XMM0_Qa;
    }
    if (game_cp._88_8_ != 0) {
      *(undefined8 *)((long)&puStack_170 + lVar2) = 0x113de0;
      operator_delete((void *)game_cp._88_8_,
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - game_cp._88_8_);
      ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
      super__Head_base<1UL,_double,_false>._M_head_impl =
           (_Head_base<1UL,_double,_false>)(_Head_base<1UL,_double,_false>)extraout_XMM0_Qa_00;
    }
    if ((size_type *)
        ret.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl
        != &infoSet._M_string_length) {
      puStack_170 = (undefined1 *)0x113e06;
      operator_delete((void *)ret.super__Tuple_impl<0UL,_double,_double>.
                              super__Head_base<0UL,_double,_false>._M_head_impl,
                      infoSet._M_string_length + 1);
      ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
      super__Head_base<1UL,_double,_false>._M_head_impl =
           (_Head_base<1UL,_double,_false>)
           (_Head_base<1UL,_double,_false>)extraout_XMM0_Qa_01._M_head_impl;
    }
  }
  tVar10.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       value._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
       super__Head_base<1UL,_double,_false>._M_head_impl;
  return (tuple<double,_double>)tVar10.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<double, double> Trainer<T>::outcomeSamplingCFR(const T &game, const int playerIndex, const int iteration , const double pi, const double po, const double s) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return std::make_tuple(game.payoff(playerIndex) / s, 1.0);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // outcome sampling with stochastically-weighted averaging cannot treat static player
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    assert(mUpdate[player] && "Outcome sampling with stochastically-weighted averaging cannot treat static player.");

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    node->updateStrategy();
    const double *strategy = node->strategy();

    // if current player is the target player, sample a single action according to epsilon-on-policy
    // otherwise, sample a single action according to the player's strategy
    const double epsilon = 0.6;
    double probability[actionNum];
    if (player == playerIndex) {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = (epsilon / (double) actionNum) + (1.0 - epsilon) * strategy[a];
        }
    } else {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = strategy[a];
        }
    }
    std::discrete_distribution<int> dist(probability, probability + actionNum);
    const int action = dist(mEngine);

    // for sampled action, recursively call cfr with additional history and probability
    double util, pTail;
    auto game_cp(game);
    game_cp.step(action);
    const double newPi = pi * (player == playerIndex ? strategy[action] : 1.0);
    const double newPo = po * (player == playerIndex ? 1.0 : strategy[action]);
    std::tuple<double, double> ret = outcomeSamplingCFR(game_cp, playerIndex, iteration, newPi, newPo, s * probability[action]);
    util = std::get<0>(ret);
    pTail = std::get<1>(ret);
    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        const double W = util * po;
        for (int a = 0; a < actionNum; ++a) {
            const double regret = a == action ? W * (1.0 - strategy[action]) * pTail : -W * pTail * strategy[action];
            const double regretSum = node->regretSum(a) + regret;
            node->regretSum(a, regretSum);
        }
    } else {
        // update average strategy
        node->strategySum(strategy, po / s);
    }
    return std::make_tuple(util, pTail * strategy[action]);
}